

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall ktx::ValidationContext::validateDFD(ValidationContext *this)

{
  uint32_t *__s;
  char *pcVar1;
  size_t sVar2;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  ulong uVar4;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong *puVar9;
  char *args_3;
  uint uVar10;
  ulong uVar11;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  uint32_t numBlocks;
  ktx_uint32_t dfdByteLength;
  vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> samples;
  size_t remainingDFDBytes;
  uint32_t dfdTotalSize;
  uint numSamplesStored;
  uint local_c0;
  uint local_bc;
  ValidationContext *local_b8;
  uint32_t *local_b0;
  string local_a8;
  int local_80;
  uint local_7c;
  string local_78;
  ulong local_58;
  uint32_t local_4c;
  ulong local_48 [3];
  
  uVar11 = (ulong)(this->header).dataFormatDescriptor.byteOffset;
  local_7c = (this->header).dataFormatDescriptor.byteLength;
  if (local_7c == 0 || uVar11 == 0) {
    return;
  }
  uVar4 = (ulong)local_7c;
  __s = (uint32_t *)operator_new__(uVar4);
  memset(__s,0,uVar4);
  args_3 = "the DFD";
  (*this->_vptr_ValidationContext[2])(this,uVar11,__s,uVar4,7);
  uVar7 = local_7c;
  uVar11 = (ulong)local_7c;
  local_4c = *__s;
  if (local_7c != local_4c) {
    error<unsigned_int_const&,unsigned_int&>(this,&DFD::SizeMismatch,&local_7c,&local_4c);
  }
  local_c0 = 0;
  if (4 < uVar7) {
    puVar9 = (ulong *)(__s + 1);
    local_bc = 0;
    local_b8 = this;
    local_b0 = __s;
    do {
      local_58 = (long)(uVar11 + (long)__s) - (long)puVar9;
      uVar7 = local_c0 + 1;
      if (10 < uVar7) {
        local_c0 = uVar7;
        warning<unsigned_int&,unsigned_long_const&>
                  (local_b8,&DFD::TooManyDFDBlocks,&local_c0,&local_58);
        break;
      }
      if (local_58 < 8) {
        local_c0 = uVar7;
        error<unsigned_long_const&>(local_b8,&DFD::NotEnoughDataForBlockHeader,&local_58);
        break;
      }
      uVar4 = *puVar9;
      uVar10 = (uint)(ushort)(uVar4 >> 0x30);
      if (uVar4 < 0x8000000000000) {
        local_a8._M_dataplus._M_p._0_4_ = uVar10;
        local_c0 = uVar7;
        error<unsigned_int&,int>
                  (local_b8,&DFD::DescriptorBlockSizeTooSmall,&local_c0,(int *)&local_a8);
      }
      else if (local_58 < uVar4 >> 0x30) {
        local_a8._M_dataplus._M_p._0_4_ = uVar10;
        local_c0 = uVar7;
        error<unsigned_int&,int,unsigned_long_const&>
                  (local_b8,&DFD::DescriptorBlockSizeTooBig,&local_c0,(int *)&local_a8,&local_58);
      }
      else {
        uVar5 = (uint)uVar4;
        uVar6 = uVar4 & 0xfffe0000;
        if (uVar6 == 0 && (uVar4 & 0x1ffff) == 0) {
          if ((local_bc & 1) == 0) {
            if ((uint)(uVar4 >> 0x33) < 3) {
              local_a8._M_dataplus._M_p._0_4_ = uVar10;
              local_c0 = uVar7;
              error<unsigned_int&,int>
                        (local_b8,&DFD::BasicDescriptorBlockSizeTooSmall,&local_c0,(int *)&local_a8)
              ;
              uVar3 = extraout_RAX;
            }
            else {
              if (local_c0 != 0) {
                local_bc = 0;
                local_c0 = uVar7;
                goto LAB_001a8b4f;
              }
              local_a8._M_dataplus._M_p = (pointer)*puVar9;
              local_a8._M_string_length = puVar9[1];
              local_a8.field_2._M_allocated_capacity = puVar9[2];
              local_c0 = uVar7;
              if (((ulong)local_a8._M_dataplus._M_p & 0xf000000000000) != 0x8000000000000) {
                local_78._M_dataplus._M_p._0_4_ =
                     (uint)(ushort)((ulong)local_a8._M_dataplus._M_p >> 0x30);
                error<unsigned_int&,int>
                          (local_b8,&DFD::BasicDescriptorBlockSizeInvalid,&local_c0,(int *)&local_78
                          );
              }
              uVar8 = (ushort)((ulong)local_a8._M_dataplus._M_p >> 0x30) - 0x18;
              uVar5 = uVar8 >> 4;
              local_48[0] = CONCAT44(local_48[0]._4_4_,uVar5);
              uVar7 = 0x10;
              if (uVar8 < 0x100) {
                uVar7 = uVar5;
              }
              if (0x10f < uVar8) {
                local_80 = uVar5 - uVar7;
                local_78._M_dataplus._M_p =
                     (pointer)((((ulong)local_a8._M_dataplus._M_p >> 0x30) - (ulong)(uVar7 << 4)) -
                              0x18);
                args_3 = (char *)&local_80;
                warning<unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_int,unsigned_long>
                          (local_b8,&DFD::TooManySamples,&local_c0,(uint *)local_48,
                           &MAX_NUM_BDFD_SAMPLES,(uint *)args_3,(unsigned_long *)&local_78);
              }
              std::vector<ktx::SampleType,_std::allocator<ktx::SampleType>_>::vector
                        ((vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)&local_78,
                         (ulong)uVar7,(allocator_type *)&local_80);
              memcpy(local_78._M_dataplus._M_p,puVar9 + 3,(ulong)(uVar7 << 4));
              validateDFDBasic(local_b8,local_c0,local_b0,(BDFD *)&local_a8,
                               (vector<ktx::SampleType,_std::allocator<ktx::SampleType>_> *)
                               &local_78);
              uVar3 = extraout_RAX_00;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_78._M_dataplus._M_p,
                                local_78.field_2._M_allocated_capacity -
                                (long)local_78._M_dataplus._M_p);
                uVar3 = extraout_RAX_01;
              }
            }
            local_bc = (uint)CONCAT71((int7)((ulong)uVar3 >> 8),1);
          }
          else {
            local_bc = (uint)CONCAT71((uint7)(uint3)(local_c0 >> 8),1);
            local_c0 = uVar7;
            warning<unsigned_int&>(local_b8,&DFD::MultipleBDFD,&local_c0);
          }
        }
        else {
          local_c0 = uVar7;
          if (uVar6 != 0xc0040000 || (uVar4 & 0x1ffff) != 0) {
            if ((uVar4 & 0x1ffff) == 0) {
              if ((int)uVar6 == -0x3ffe0000) goto LAB_001a8b4f;
              pcVar1 = (char *)dfdToStringVendorID(0);
              if (pcVar1 == (char *)0x0) {
                local_78._M_dataplus._M_p = (pointer)0x0;
                fmt_01.size_ = 2;
                fmt_01.data_ = (char *)0xa;
                args_01.field_1.values_ =
                     (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
                args_01.desc_ = (unsigned_long_long)&local_78;
                ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)"(0x{:05X})",fmt_01,args_01);
              }
              else {
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                sVar2 = strlen(pcVar1);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,pcVar1,pcVar1 + sVar2);
              }
              pcVar1 = (char *)dfdToStringDescriptorType(uVar5 >> 0x11);
              if (pcVar1 == (char *)0x0) {
                local_48[0] = (ulong)(uVar5 >> 0x11);
                fmt_02.size_ = 2;
                fmt_02.data_ = (char *)0xa;
                args_02.field_1 =
                     (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                        )args_3;
                args_02.desc_ = (unsigned_long_long)local_48;
                ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:04X})",fmt_02,args_02);
              }
              else {
                local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
                sVar2 = strlen(pcVar1);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_78,pcVar1,pcVar1 + sVar2);
              }
            }
            else {
              pcVar1 = (char *)dfdToStringVendorID();
              if (pcVar1 == (char *)0x0) {
                local_78._M_dataplus._M_p = (pointer)(ulong)(uVar5 & 0x1ffff);
                fmt.size_ = 2;
                fmt.data_ = (char *)0xa;
                args.field_1.values_ =
                     (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
                args.desc_ = (unsigned_long_long)&local_78;
                ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)"(0x{:05X})",fmt,args);
              }
              else {
                local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                sVar2 = strlen(pcVar1);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a8,pcVar1,pcVar1 + sVar2);
              }
              local_48[0] = (ulong)(uVar5 >> 0x11);
              fmt_00.size_ = 2;
              fmt_00.data_ = (char *)0xa;
              args_00.field_1.values_ =
                   (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)args_3;
              args_00.desc_ = (unsigned_long_long)local_48;
              ::fmt::v10::vformat_abi_cxx11_(&local_78,(v10 *)"(0x{:04X})",fmt_00,args_00);
            }
            warning<unsigned_int&,std::__cxx11::string,std::__cxx11::string>
                      (local_b8,&DFD::UnknownDFDBlock,&local_c0,&local_a8,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
LAB_001a8b4f:
      uVar4 = 8;
      if (8 < uVar10) {
        uVar4 = (ulong)uVar10;
      }
      puVar9 = (ulong *)((long)puVar9 + uVar4);
    } while (puVar9 < (ulong *)(uVar11 + (long)__s));
    __s = local_b0;
    this = local_b8;
    if ((local_bc & 1) != 0) goto LAB_001a8d7e;
  }
  error<>(this,&DFD::MissingBDFD);
LAB_001a8d7e:
  operator_delete__(__s);
  return;
}

Assistant:

void ValidationContext::validateDFD() {
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;

    if (dfdByteOffset == 0 || dfdByteLength == 0)
        return; // There is no DFD block

    const auto buffer = std::make_unique<uint8_t[]>(dfdByteLength);
    read(dfdByteOffset, buffer.get(), dfdByteLength, "the DFD");
    const auto* ptrDFD = buffer.get();
    const auto* ptrDFDEnd = ptrDFD + dfdByteLength;
    const auto* ptrDFDIt = ptrDFD;

    uint32_t dfdTotalSize;
    std::memcpy(&dfdTotalSize, ptrDFDIt, sizeof(uint32_t));
    ptrDFDIt += sizeof(uint32_t);

    if (dfdByteLength != dfdTotalSize)
        error(DFD::SizeMismatch, dfdByteLength, dfdTotalSize);

    uint32_t numBlocks = 0;
    bool foundBDFD = false;

    while (ptrDFDIt < ptrDFDEnd) {
        const auto remainingDFDBytes = static_cast<std::size_t>(ptrDFDEnd - ptrDFDIt);

        if (++numBlocks > MAX_NUM_DFD_BLOCKS) {
            warning(DFD::TooManyDFDBlocks, numBlocks, remainingDFDBytes);
            break;
        }

        DFDHeader blockHeader{};
        if (remainingDFDBytes < sizeof(DFDHeader)) {
            error(DFD::NotEnoughDataForBlockHeader, remainingDFDBytes);
            break;
        }

        std::memcpy(&blockHeader, ptrDFDIt, sizeof(DFDHeader));

        if (blockHeader.descriptorBlockSize < sizeof(DFDHeader)) {
            error(DFD::DescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

        } else if (blockHeader.descriptorBlockSize > remainingDFDBytes) {
            error(DFD::DescriptorBlockSizeTooBig, numBlocks, +blockHeader.descriptorBlockSize, remainingDFDBytes);

        } else {
            if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT) {
                if (std::exchange(foundBDFD, true)) {
                    warning(DFD::MultipleBDFD, numBlocks);

                } else if (blockHeader.descriptorBlockSize < sizeof(BDFD)) {
                    error(DFD::BasicDescriptorBlockSizeTooSmall, numBlocks, +blockHeader.descriptorBlockSize);

                } else if (numBlocks != 1) {
                    // The Basic DFD block has to be the first block.
                    foundBDFD = false;

                } else {
                    BDFD block{};
                    std::memcpy(&block, ptrDFDIt, sizeof(BDFD));

                    if ((block.descriptorBlockSize - 24) % 16 != 0)
                         error(DFD::BasicDescriptorBlockSizeInvalid, numBlocks, +block.descriptorBlockSize);

                    const auto numSamplesStored = (block.descriptorBlockSize - 24u) / 16u;
                    const auto numSamplesValidating = std::min(MAX_NUM_BDFD_SAMPLES, numSamplesStored);

                    if (numSamplesStored > MAX_NUM_BDFD_SAMPLES)
                        warning(DFD::TooManySamples, numBlocks, numSamplesStored, MAX_NUM_BDFD_SAMPLES,
                                numSamplesStored - numSamplesValidating,
                                block.descriptorBlockSize - sizeof(BDFD) - numSamplesValidating * sizeof(SampleType));

                    // Samples are located at the end of the block
                    std::vector<SampleType> samples(numSamplesValidating);
                    std::memcpy(samples.data(), ptrDFDIt + sizeof(BDFD), numSamplesValidating * sizeof(SampleType));

                    validateDFDBasic(numBlocks, reinterpret_cast<uint32_t*>(buffer.get()), block, samples);
                }

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS) {
                // TODO: Implement DFD validation for ADDITIONAL_DIMENSIONS

            } else if (blockHeader.vendorId == KHR_DF_VENDORID_KHRONOS && blockHeader.descriptorType == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES) {
                // TODO: Implement DFD validation for ADDITIONAL_PLANES

            } else {
                warning(DFD::UnknownDFDBlock,
                        numBlocks,
                        toString(khr_df_vendorid_e(blockHeader.vendorId)),
                        toString(khr_df_vendorid_e(blockHeader.vendorId), khr_df_khr_descriptortype_e(blockHeader.descriptorType)));
            }
        }

        ptrDFDIt += std::max(blockHeader.descriptorBlockSize, 8u);
    }

    if (!foundBDFD)
        error(DFD::MissingBDFD);
}